

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

AsinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_asin(NeuralNetworkLayer *this)

{
  AsinLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x2da) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2da;
    this_00 = (AsinLayerParams *)operator_new(0x18);
    AsinLayerParams::AsinLayerParams(this_00);
    (this->layer_).asin_ = this_00;
  }
  return (AsinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AsinLayerParams* NeuralNetworkLayer::mutable_asin() {
  if (!has_asin()) {
    clear_layer();
    set_has_asin();
    layer_.asin_ = new ::CoreML::Specification::AsinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.asin)
  return layer_.asin_;
}